

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O2

void __thiscall
blockencodings_tests::EmptyBlockRoundTripTest::test_method(EmptyBlockRoundTripTest *this)

{
  long lVar1;
  CTxMemPool *poolIn;
  uint256 hash;
  uint32_t nBits;
  bool bVar2;
  ReadStatus RVar3;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar4;
  CChainParams *params;
  uint64_t nonce;
  char *pcVar5;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  string *psVar8;
  string *psVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  check_type cVar10;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  assertion_result local_538;
  string *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx_missing;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_478;
  undefined8 uStack_460;
  bool mutated;
  CMutableTransaction coinbase;
  uint256 local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  CBlock block2;
  PartiallyDownloadedBlock partialBlock;
  CBlockHeaderAndShortTxIDs shortIDs2;
  CBlockHeaderAndShortTxIDs shortIDs;
  uint256 local_150;
  FastRandomContext rand_ctx;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = "m_node.mempool";
  puVar4 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                     (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                      ,0x10f,"test_method","m_node.mempool");
  poolIn = (puVar4->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  BuildTransactionTestCase();
  CBlock::CBlock(&block);
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = '*';
  FastRandomContext::FastRandomContext(&rand_ctx,(uint256 *)&partialBlock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&block.vtx,1);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&partialBlock);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(block.vtx.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&partialBlock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  block.super_CBlockHeader.nVersion = 0x2a;
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)&partialBlock,&rand_ctx.super_RandomMixin<FastRandomContext>);
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._1_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_7_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._9_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._1_7_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._17_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] =
       (undefined1)partialBlock.prefilled_count;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] =
       partialBlock.prefilled_count._1_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] =
       partialBlock.prefilled_count._2_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] =
       partialBlock.prefilled_count._3_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] =
       partialBlock.prefilled_count._4_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] =
       partialBlock.prefilled_count._5_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] =
       partialBlock.prefilled_count._6_1_;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] =
       partialBlock.prefilled_count._7_1_;
  block.super_CBlockHeader.nBits = 0x207fffff;
  BlockMerkleRoot((uint256 *)&partialBlock,&block,&mutated);
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._1_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start._1_7_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._9_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._1_7_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._17_7_ =
       partialBlock.txn_available.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)partialBlock.txn_available.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] =
       (undefined1)partialBlock.prefilled_count;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] =
       partialBlock.prefilled_count._1_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] =
       partialBlock.prefilled_count._2_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] =
       partialBlock.prefilled_count._3_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] =
       partialBlock.prefilled_count._4_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] =
       partialBlock.prefilled_count._5_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
       partialBlock.prefilled_count._6_1_;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] =
       partialBlock.prefilled_count._7_1_;
  if (mutated != false) {
    __assert_fail("!mutated",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                  ,0x11c,"void blockencodings_tests::EmptyBlockRoundTripTest::test_method()");
  }
  while( true ) {
    CBlockHeader::GetHash(&local_150,&block.super_CBlockHeader);
    nBits = block.super_CBlockHeader.nBits;
    params = Params();
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_150.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_150.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_150.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_150.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_150.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_150.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_150.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_150.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_150.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_150.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_150.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x10];
    hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x11];
    hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x12];
    hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x13];
    hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x14];
    hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x15];
    hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x16];
    hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x17];
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1f];
    _cVar10 = (check_type)local_150.super_base_blob<256U>.m_data._M_elems._8_8_;
    bVar2 = CheckProofOfWork(hash,nBits,&params->consensus);
    if (bVar2) break;
    block.super_CBlockHeader.nNonce = block.super_CBlockHeader.nNonce + 1;
  }
  nonce = FastRandomContext::rand64(&rand_ctx);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(&shortIDs,&block,nonce);
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_460 = 0;
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs_const,ActionSerialize>(&shortIDs);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(&shortIDs2);
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,&local_478);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock(&partialBlock,poolIn);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pcVar5;
  file.m_end = (iterator)0x12a;
  file.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_498,msg);
  RVar3 = PartiallyDownloadedBlock::InitData(&partialBlock,&shortIDs2,&empty_extra_txn);
  local_538.m_message.px = (element_type *)0x0;
  local_538.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3b8._M_dataplus._M_p = "partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK"
  ;
  local_3b8._M_string_length = 0xb5eb00;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_0113a070;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_4a0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_3b8;
  local_538.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar3 == READ_STATUS_OK);
  boost::test_tools::tt_detail::report_assertion
            (&local_538,(lazy_ostream *)&block2,1,0,WARN,_cVar10,(size_t)&local_4a8,0x12a);
  boost::detail::shared_count::~shared_count(&local_538.m_message.pn);
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x12b;
  file_00.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4c8,
             msg_00);
  local_538.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,0);
  local_538.m_message.px = (element_type *)0x0;
  local_538.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3b8._M_dataplus._M_p = "partialBlock.IsTxAvailable(0)";
  local_3b8._M_string_length = 0xb5ece8;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block2.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_0113a070;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_4d0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  block2.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_538,(lazy_ostream *)&block2,1,0,WARN,_cVar10,(size_t)&local_4d8,299);
  boost::detail::shared_count::~shared_count(&local_538.m_message.pn);
  CBlock::CBlock(&block2);
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x12f;
  file_01.m_begin = (iterator)&local_508;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_518,
             msg_01);
  RVar3 = PartiallyDownloadedBlock::FillBlock(&partialBlock,&block2,&vtx_missing);
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  local_520 = &local_3d8;
  local_3d8._M_dataplus._M_p = "partialBlock.FillBlock(block2, vtx_missing) == READ_STATUS_OK";
  local_3d8._M_string_length = 0xb5eefd;
  local_538.m_message.px = (element_type *)((ulong)local_538.m_message.px & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_0113a070;
  local_538.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_540 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_3b8._M_dataplus._M_p._0_1_ = RVar3 == READ_STATUS_OK;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b8,(lazy_ostream *)&local_538,1,0,WARN,_cVar10,
             (size_t)&local_548,0x12f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b8.field_2._M_allocated_capacity);
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x130;
  file_02.m_begin = (iterator)&local_558;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_568,
             msg_02);
  local_538.m_message.px = (element_type *)((ulong)local_538.m_message.px & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_01139f30;
  local_538.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_520 = (string *)0xc694e1;
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_570 = "";
  CBlockHeader::GetHash((uint256 *)&local_3d8,&block.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_(&local_3b8,(base_blob<256u> *)&local_3d8);
  CBlockHeader::GetHash(&local_418,&block2.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_(&local_3f8,(base_blob<256u> *)&local_418);
  pvVar6 = (iterator)0x2;
  psVar8 = &local_3b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_538,&local_578,0x130,1,2,psVar8,0xb5ec21,&local_3f8,
             "block2.GetHash().ToString()");
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3b8);
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar8;
  msg_03.m_begin = pvVar6;
  file_03.m_end = (iterator)0x131;
  file_03.m_begin = (iterator)&local_588;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_598,
             msg_03);
  local_538.m_message.px = (element_type *)((ulong)local_538.m_message.px & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_01139f30;
  local_538.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_520 = (string *)0xc694e1;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5a0 = "";
  base_blob<256u>::ToString_abi_cxx11_
            (&local_3b8,(base_blob<256u> *)&block.super_CBlockHeader.hashMerkleRoot);
  BlockMerkleRoot((uint256 *)&local_3f8,&block2,&mutated);
  psVar8 = &local_3d8;
  base_blob<256u>::ToString_abi_cxx11_(psVar8,(base_blob<256u> *)&local_3f8);
  pvVar6 = (iterator)0x2;
  psVar9 = &local_3b8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_538,&local_5a8,0x131,1,2,psVar9,0xb5ec58,psVar8,
             "BlockMerkleRoot(block2, &mutated).ToString()");
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar9;
  msg_04.m_begin = pvVar6;
  file_04.m_end = (iterator)0x132;
  file_04.m_begin = (iterator)&local_5b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_5c8,
             msg_04);
  local_3b8._M_dataplus._M_p = (pointer)(CONCAT71(local_3b8._M_dataplus._M_p._1_7_,mutated) ^ 1);
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_allocated_capacity = 0;
  local_3d8._M_dataplus._M_p = "!mutated";
  local_3d8._M_string_length = 0xb5ecad;
  local_538.m_message.px = (element_type *)((ulong)local_538.m_message.px & 0xffffffffffffff00);
  local_538._0_8_ = &PTR__lazy_ostream_0113a070;
  local_538.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5d0 = "";
  local_520 = &local_3d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3b8,(lazy_ostream *)&local_538,1,0,WARN,(check_type)psVar8,
             (size_t)&local_5d8,0x132);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3b8.field_2._M_allocated_capacity);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&vtx_missing);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block2.vtx);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock(&partialBlock);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs(&shortIDs2);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_478);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs(&shortIDs);
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  CMutableTransaction::~CMutableTransaction(&coinbase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(EmptyBlockRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    CMutableTransaction coinbase = BuildTransactionTestCase();

    CBlock block;
    auto rand_ctx(FastRandomContext(uint256{42}));
    block.vtx.resize(1);
    block.vtx[0] = MakeTransactionRef(std::move(coinbase));
    block.nVersion = 42;
    block.hashPrevBlock = rand_ctx.rand256();
    block.nBits = 0x207fffff;

    bool mutated;
    block.hashMerkleRoot = BlockMerkleRoot(block, &mutated);
    assert(!mutated);
    while (!CheckProofOfWork(block.GetHash(), block.nBits, Params().GetConsensus())) ++block.nNonce;

    // Test simple header round-trip with only coinbase
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(partialBlock.IsTxAvailable(0));

        CBlock block2;
        std::vector<CTransactionRef> vtx_missing;
        BOOST_CHECK(partialBlock.FillBlock(block2, vtx_missing) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block2.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block2, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}